

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  int iVar1;
  uint uVar2;
  ImFontAtlasCustomRect *pIVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar8;
  ImVec2 IVar7;
  ImVec2 IVar9;
  float fVar11;
  ImVec2 IVar10;
  ImVec2 IVar12;
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    iVar1 = this->CustomRectIds[0];
    if ((long)iVar1 == -1) {
      __assert_fail("CustomRectIds[0] != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x751,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    if ((this->CustomRects).Size <= iVar1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x52e,
                    "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]"
                   );
    }
    IVar9 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    pIVar3 = (this->CustomRects).Data + iVar1;
    uVar2._0_2_ = pIVar3->X;
    uVar2._2_2_ = pIVar3->Y;
    fVar6 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x + (float)(uVar2 & 0xffff);
    fVar8 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y + (float)(uVar2 >> 0x10);
    IVar7 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar9;
    IVar9.x = (this->TexUvScale).x * fVar6;
    IVar9.y = (this->TexUvScale).y * fVar8;
    *out_uv_border = IVar9;
    fVar5 = IVar7.x;
    fVar11 = fVar8 + IVar7.y;
    IVar12.x = (this->TexUvScale).x * (fVar6 + fVar5);
    IVar12.y = (this->TexUvScale).y * fVar11;
    out_uv_border[1] = IVar12;
    IVar7.x = (fVar6 + 109.0) * (this->TexUvScale).x;
    IVar7.y = fVar8 * (this->TexUvScale).y;
    *out_uv_fill = IVar7;
    IVar10.x = (fVar6 + 109.0 + fVar5) * (this->TexUvScale).x;
    IVar10.y = fVar11 * (this->TexUvScale).y;
    out_uv_fill[1] = IVar10;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}